

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

xmlChar * xmlParseSystemLiteral(xmlParserCtxtPtr ctxt)

{
  xmlParserInputState xVar1;
  int iVar2;
  xmlChar *pxVar3;
  bool bVar4;
  xmlChar *tmp;
  int count;
  int state;
  uint uStack_2c;
  xmlChar stop;
  int l;
  int cur;
  int size;
  int len;
  xmlChar *buf;
  xmlParserCtxtPtr ctxt_local;
  
  _size = (xmlChar *)0x0;
  cur = 0;
  l = 100;
  xVar1 = ctxt->instate;
  tmp._4_4_ = 0;
  buf = (xmlChar *)ctxt;
  if (((ctxt->progressive == 0) && (500 < (long)ctxt->input->cur - (long)ctxt->input->base)) &&
     ((long)ctxt->input->end - (long)ctxt->input->cur < 500)) {
    xmlSHRINK(ctxt);
  }
  if (**(char **)(*(long *)(buf + 0x38) + 0x20) == '\"') {
    xmlNextChar((xmlParserCtxtPtr)buf);
    count._3_1_ = 0x22;
  }
  else {
    if (**(char **)(*(long *)(buf + 0x38) + 0x20) != '\'') {
      xmlFatalErr((xmlParserCtxtPtr)buf,XML_ERR_LITERAL_NOT_STARTED,(char *)0x0);
      return (xmlChar *)0x0;
    }
    xmlNextChar((xmlParserCtxtPtr)buf);
    count._3_1_ = 0x27;
  }
  _size = (xmlChar *)(*xmlMallocAtomic)((long)l);
  if (_size == (xmlChar *)0x0) {
    xmlErrMemory((xmlParserCtxtPtr)buf,(char *)0x0);
    return (xmlChar *)0x0;
  }
  buf[0x110] = '\r';
  buf[0x111] = '\0';
  buf[0x112] = '\0';
  buf[0x113] = '\0';
  uStack_2c = xmlCurrentChar((xmlParserCtxtPtr)buf,&state);
  do {
    if ((int)uStack_2c < 0x100) {
      if (((8 < (int)uStack_2c) && ((int)uStack_2c < 0xb)) ||
         ((uStack_2c == 0xd || (bVar4 = false, 0x1f < (int)uStack_2c)))) {
LAB_0017aa33:
        bVar4 = uStack_2c != count._3_1_;
      }
    }
    else if ((((0xff < (int)uStack_2c) && ((int)uStack_2c < 0xd800)) ||
             ((0xdfff < (int)uStack_2c && ((int)uStack_2c < 0xfffe)))) ||
            ((bVar4 = false, 0xffff < (int)uStack_2c && (bVar4 = false, (int)uStack_2c < 0x110000)))
            ) goto LAB_0017aa33;
    if (!bVar4) {
      _size[cur] = '\0';
      *(xmlParserInputState *)(buf + 0x110) = xVar1;
      if ((int)uStack_2c < 0x100) {
        if (((8 < (int)uStack_2c) && ((int)uStack_2c < 0xb)) ||
           ((uStack_2c == 0xd || (0x1f < (int)uStack_2c)))) {
LAB_0017ad90:
          xmlNextChar((xmlParserCtxtPtr)buf);
          return _size;
        }
      }
      else if ((((0xff < (int)uStack_2c) && ((int)uStack_2c < 0xd800)) ||
               ((0xdfff < (int)uStack_2c && ((int)uStack_2c < 0xfffe)))) ||
              ((0xffff < (int)uStack_2c && ((int)uStack_2c < 0x110000)))) goto LAB_0017ad90;
      xmlFatalErr((xmlParserCtxtPtr)buf,XML_ERR_LITERAL_NOT_FINISHED,(char *)0x0);
      return _size;
    }
    pxVar3 = _size;
    if (l <= cur + 5) {
      if ((50000 < l) && ((*(uint *)(buf + 0x234) & 0x80000) == 0)) {
        xmlFatalErr((xmlParserCtxtPtr)buf,XML_ERR_NAME_TOO_LONG,"SystemLiteral");
        (*xmlFree)(_size);
        *(xmlParserInputState *)(buf + 0x110) = xVar1;
        return (xmlChar *)0x0;
      }
      l = l << 1;
      pxVar3 = (xmlChar *)(*xmlRealloc)(_size,(long)l);
      if (pxVar3 == (xmlChar *)0x0) {
        (*xmlFree)(_size);
        xmlErrMemory((xmlParserCtxtPtr)buf,(char *)0x0);
        *(xmlParserInputState *)(buf + 0x110) = xVar1;
        return (xmlChar *)0x0;
      }
    }
    _size = pxVar3;
    tmp._4_4_ = tmp._4_4_ + 1;
    if (0x32 < tmp._4_4_) {
      if ((*(int *)(buf + 0x1c4) == 0) &&
         (*(long *)(*(long *)(buf + 0x38) + 0x28) - *(long *)(*(long *)(buf + 0x38) + 0x20) < 0xfa))
      {
        xmlGROW((xmlParserCtxtPtr)buf);
      }
      tmp._4_4_ = 0;
      if (*(int *)(buf + 0x110) == -1) {
        (*xmlFree)(_size);
        return (xmlChar *)0x0;
      }
    }
    if (state == 1) {
      _size[cur] = (xmlChar)uStack_2c;
      cur = cur + 1;
    }
    else {
      iVar2 = xmlCopyCharMultiByte(_size + cur,uStack_2c);
      cur = iVar2 + cur;
    }
    if (**(char **)(*(long *)(buf + 0x38) + 0x20) == '\n') {
      *(int *)(*(long *)(buf + 0x38) + 0x34) = *(int *)(*(long *)(buf + 0x38) + 0x34) + 1;
      *(undefined4 *)(*(long *)(buf + 0x38) + 0x38) = 1;
    }
    else {
      *(int *)(*(long *)(buf + 0x38) + 0x38) = *(int *)(*(long *)(buf + 0x38) + 0x38) + 1;
    }
    *(long *)(*(long *)(buf + 0x38) + 0x20) = *(long *)(*(long *)(buf + 0x38) + 0x20) + (long)state;
    uStack_2c = xmlCurrentChar((xmlParserCtxtPtr)buf,&state);
    if (uStack_2c == 0) {
      if ((*(int *)(buf + 0x1c4) == 0) &&
         (*(long *)(*(long *)(buf + 0x38) + 0x28) - *(long *)(*(long *)(buf + 0x38) + 0x20) < 0xfa))
      {
        xmlGROW((xmlParserCtxtPtr)buf);
      }
      if (((*(int *)(buf + 0x1c4) == 0) &&
          (500 < *(long *)(*(long *)(buf + 0x38) + 0x20) - *(long *)(*(long *)(buf + 0x38) + 0x18)))
         && (*(long *)(*(long *)(buf + 0x38) + 0x28) - *(long *)(*(long *)(buf + 0x38) + 0x20) < 500
            )) {
        xmlSHRINK((xmlParserCtxtPtr)buf);
      }
      uStack_2c = xmlCurrentChar((xmlParserCtxtPtr)buf,&state);
    }
  } while( true );
}

Assistant:

xmlChar *
xmlParseSystemLiteral(xmlParserCtxtPtr ctxt) {
    xmlChar *buf = NULL;
    int len = 0;
    int size = XML_PARSER_BUFFER_SIZE;
    int cur, l;
    xmlChar stop;
    int state = ctxt->instate;
    int count = 0;

    SHRINK;
    if (RAW == '"') {
        NEXT;
	stop = '"';
    } else if (RAW == '\'') {
        NEXT;
	stop = '\'';
    } else {
	xmlFatalErr(ctxt, XML_ERR_LITERAL_NOT_STARTED, NULL);
	return(NULL);
    }

    buf = (xmlChar *) xmlMallocAtomic(size * sizeof(xmlChar));
    if (buf == NULL) {
        xmlErrMemory(ctxt, NULL);
	return(NULL);
    }
    ctxt->instate = XML_PARSER_SYSTEM_LITERAL;
    cur = CUR_CHAR(l);
    while ((IS_CHAR(cur)) && (cur != stop)) { /* checked */
	if (len + 5 >= size) {
	    xmlChar *tmp;

            if ((size > XML_MAX_NAME_LENGTH) &&
                ((ctxt->options & XML_PARSE_HUGE) == 0)) {
                xmlFatalErr(ctxt, XML_ERR_NAME_TOO_LONG, "SystemLiteral");
                xmlFree(buf);
		ctxt->instate = (xmlParserInputState) state;
                return(NULL);
            }
	    size *= 2;
	    tmp = (xmlChar *) xmlRealloc(buf, size * sizeof(xmlChar));
	    if (tmp == NULL) {
	        xmlFree(buf);
		xmlErrMemory(ctxt, NULL);
		ctxt->instate = (xmlParserInputState) state;
		return(NULL);
	    }
	    buf = tmp;
	}
	count++;
	if (count > 50) {
	    GROW;
	    count = 0;
            if (ctxt->instate == XML_PARSER_EOF) {
	        xmlFree(buf);
		return(NULL);
            }
	}
	COPY_BUF(l,buf,len,cur);
	NEXTL(l);
	cur = CUR_CHAR(l);
	if (cur == 0) {
	    GROW;
	    SHRINK;
	    cur = CUR_CHAR(l);
	}
    }
    buf[len] = 0;
    ctxt->instate = (xmlParserInputState) state;
    if (!IS_CHAR(cur)) {
	xmlFatalErr(ctxt, XML_ERR_LITERAL_NOT_FINISHED, NULL);
    } else {
	NEXT;
    }
    return(buf);
}